

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::analysis::LivenessManager::IsAnalyzedBuiltin(LivenessManager *this,uint32_t bi)

{
  return bi == 4 || (bi & 0xfffffffd) == 1;
}

Assistant:

bool LivenessManager::IsAnalyzedBuiltin(uint32_t bi) {
  // There are only three builtins that can be analyzed and removed between
  // two stages: PointSize, ClipDistance and CullDistance. All others are
  // always consumed implicitly by the downstream stage.
  const auto builtin = spv::BuiltIn(bi);
  return builtin == spv::BuiltIn::PointSize ||
         builtin == spv::BuiltIn::ClipDistance ||
         builtin == spv::BuiltIn::CullDistance;
}